

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O0

void * HTS_calloc(size_t num,size_t size)

{
  size_t __size;
  long in_RSI;
  long in_RDI;
  void *mem;
  size_t n;
  void *local_8;
  
  __size = in_RDI * in_RSI;
  if (__size == 0) {
    local_8 = (void *)0x0;
  }
  else {
    local_8 = malloc(__size);
    memset(local_8,0,__size);
    if (local_8 == (void *)0x0) {
      HTS_error(1,"HTS_calloc: Cannot allocate memory.\n");
    }
  }
  return local_8;
}

Assistant:

void *HTS_calloc(const size_t num, const size_t size)
{
   size_t n = num * size;
   void *mem;

   if (n == 0)
      return NULL;

#ifdef FESTIVAL
   mem = (void *) safe_wcalloc(n);
#else
   mem = (void *) malloc(n);
#endif                          /* FESTIVAL */

   memset(mem, 0, n);

   if (mem == NULL)
      HTS_error(1, "HTS_calloc: Cannot allocate memory.\n");

   return mem;
}